

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

Enum xatlas::AddMesh(Atlas *atlas,MeshDecl *meshDecl,uint32_t meshCountHint)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  Enum EVar5;
  code *pcVar6;
  uint32_t *puVar7;
  void *pvVar8;
  uint8_t *puVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Atlas *pAVar12;
  char cVar13;
  TaskGroupHandle TVar14;
  undefined4 *puVar15;
  Mesh *this;
  undefined8 *puVar16;
  ulong uVar17;
  Enum EVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  bool ignore;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  Task task;
  uint32_t tri [3];
  Vector3 local_70;
  Vector3 local_60;
  long local_50;
  Vector2 local_48;
  Atlas *local_40;
  ulong local_38;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x220b,"AddMeshError::Enum xatlas::AddMesh(Atlas *, const MeshDecl &, uint32_t)")
    ;
  }
  if (*(int *)&atlas[4].field_0x14 == 0) {
    if (*(Progress **)&atlas[1].atlasCount == (Progress *)0x0) {
      puVar15 = (undefined4 *)(*(code *)internal::s_realloc)(0,0x50);
      if (puVar15 == (undefined4 *)0x0) goto LAB_001a20dc;
      pcVar6 = *(code **)&atlas[3].texelsPerUnit;
      puVar7 = atlas[3].image;
      *puVar15 = 0;
      *(undefined1 *)(puVar15 + 1) = 0;
      puVar15[2] = 0;
      *(code **)(puVar15 + 4) = pcVar6;
      *(uint32_t **)(puVar15 + 6) = puVar7;
      puVar15[8] = 1;
      *(undefined8 *)(puVar15 + 9) = 0;
      *(undefined8 *)(puVar15 + 0xb) = 0;
      *(undefined8 *)(puVar15 + 0xd) = 0;
      *(undefined8 *)(puVar15 + 0xf) = 0;
      *(undefined8 *)(puVar15 + 0x10) = 0;
      *(undefined8 *)(puVar15 + 0x12) = 0;
      if ((pcVar6 != (code *)0x0) && (cVar13 = (*pcVar6)(0,0), cVar13 == '\0')) {
        LOCK();
        *(undefined1 *)(puVar15 + 1) = 1;
        UNLOCK();
      }
      *(undefined4 **)&atlas[1].atlasCount = puVar15;
    }
    else {
      uVar21 = atlas[1].width + 1;
      if (uVar21 <= meshCountHint) {
        uVar21 = meshCountHint;
      }
      internal::Progress::setMaxValue(*(Progress **)&atlas[1].atlasCount,uVar21);
    }
    uVar20 = (ulong)meshDecl->indexCount;
    uVar21 = meshDecl->indexCount;
    if (uVar20 == 0) {
      uVar21 = meshDecl->vertexCount;
    }
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      (*(code *)internal::s_print)
                ("Adding mesh %d: %u vertices, %u triangles\n",atlas[1].width,meshDecl->vertexCount,
                 (ulong)uVar21 / 3);
    }
    EVar18 = InvalidIndexCount;
    if (uVar21 * -0x55555555 < 0x55555556) {
      if (uVar21 != 0 && uVar20 != 0) {
        pvVar8 = meshDecl->indexData;
        if (pvVar8 == (void *)0x0) {
LAB_001a1fe4:
          __assert_fail("indexData",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x2203,
                        "uint32_t xatlas::DecodeIndex(IndexFormat::Enum, const void *, int32_t, uint32_t)"
                       );
        }
        uVar24 = 0;
        do {
          if (meshDecl->indexFormat == UInt16) {
            uVar27 = (uint)(ushort)(*(short *)((long)pvVar8 + uVar24 * 2) +
                                   (short)meshDecl->indexOffset);
          }
          else {
            uVar27 = *(int *)((long)pvVar8 + uVar24 * 4) + meshDecl->indexOffset;
          }
          if (meshDecl->vertexCount <= uVar27) {
            return IndexOutOfRange;
          }
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
      }
      local_50 = CONCAT44(local_50._4_4_,uVar21);
      pvVar8 = meshDecl->vertexNormalData;
      this = (Mesh *)(*(code *)internal::s_realloc)(0,0x1c0);
      if (this != (Mesh *)0x0) {
        local_40 = atlas;
        internal::Mesh::Mesh
                  (this,meshDecl->epsilon,meshDecl->vertexCount,uVar21 / 3,
                   (uint)(pvVar8 != (void *)0x0) * 4 + 3,atlas[1].width);
        if (meshDecl->vertexCount != 0) {
          uVar27 = 0;
          do {
            local_60.x = 0.0;
            local_60.y = 0.0;
            local_60.z = 0.0;
            local_48.x = 0.0;
            local_48.y = 0.0;
            pvVar8 = meshDecl->vertexNormalData;
            if (pvVar8 != (void *)0x0) {
              if (meshDecl->vertexNormalStride == 0) {
                __assert_fail("meshDecl.vertexNormalStride > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                              ,0x21f6,
                              "internal::Vector3 xatlas::DecodeNormal(const MeshDecl &, uint32_t)");
              }
              uVar24 = (ulong)(meshDecl->vertexNormalStride * uVar27);
              local_60._0_8_ = *(ulong *)((long)pvVar8 + uVar24);
              local_60.z = *(float *)((long)pvVar8 + uVar24 + 8);
            }
            if (meshDecl->vertexUvData != (void *)0x0) {
              if (meshDecl->vertexUvStride == 0) {
                __assert_fail("meshDecl.vertexUvStride > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                              ,0x21fd,
                              "internal::Vector2 xatlas::DecodeUv(const MeshDecl &, uint32_t)");
              }
              local_48 = *(Vector2 *)
                          ((long)meshDecl->vertexUvData + (ulong)(meshDecl->vertexUvStride * uVar27)
                          );
            }
            pvVar8 = meshDecl->vertexPositionData;
            if (pvVar8 == (void *)0x0) {
              __assert_fail("meshDecl.vertexPositionData",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x21ee,
                            "internal::Vector3 xatlas::DecodePosition(const MeshDecl &, uint32_t)");
            }
            if (meshDecl->vertexPositionStride == 0) {
              __assert_fail("meshDecl.vertexPositionStride > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x21ef,
                            "internal::Vector3 xatlas::DecodePosition(const MeshDecl &, uint32_t)");
            }
            uVar24 = (ulong)(meshDecl->vertexPositionStride * uVar27);
            local_70._0_8_ = *(ulong *)((long)pvVar8 + uVar24);
            local_70.z = *(float *)((long)pvVar8 + uVar24 + 8);
            internal::Mesh::addVertex(this,&local_70,&local_60,&local_48);
            uVar27 = uVar27 + 1;
          } while (uVar27 < meshDecl->vertexCount);
        }
        if (2 < (uint)local_50) {
          lVar19 = 0;
          uVar24 = 0;
          local_38 = (ulong)uVar21 / 3;
LAB_001a1a22:
          pvVar8 = meshDecl->indexData;
          iVar4 = meshDecl->indexOffset;
          EVar5 = meshDecl->indexFormat;
          lVar25 = 0;
          lVar22 = lVar19;
          do {
            if (uVar20 == 0) {
              fVar28 = (float)lVar22;
            }
            else {
              if (pvVar8 == (void *)0x0) goto LAB_001a1fe4;
              if (EVar5 == UInt16) {
                fVar28 = (float)(uint)(ushort)(*(short *)((long)pvVar8 + lVar22 * 2) + (short)iVar4)
                ;
              }
              else {
                fVar28 = (float)(*(int *)((long)pvVar8 + lVar22 * 4) + iVar4);
              }
            }
            (&local_70.x)[lVar25] = fVar28;
            lVar25 = lVar25 + 1;
            lVar22 = lVar22 + 1;
          } while (lVar25 != 3);
          lVar22 = 0;
          do {
            if (lVar22 == 3) {
              lVar22 = 0;
              goto LAB_001a1b7e;
            }
            fVar28 = (&local_70.x)[lVar22];
            uVar23 = (ulong)(uint)fVar28;
            lVar25 = 0;
            if (lVar22 != 2) {
              lVar25 = lVar22 + 1;
            }
            fVar33 = (&local_70.x)[lVar25];
            uVar17 = (ulong)(uint)fVar33;
            if (fVar28 == fVar33) {
              ignore = true;
              if ((internal::s_print == (undefined *)0x0) || (internal::s_printVerbose != '\x01'))
              goto LAB_001a1d0a;
              (*(code *)internal::s_print)("   Degenerate edge: index %d, index %d\n",uVar23,fVar28)
              ;
              goto LAB_001a1cf8;
            }
            fVar35 = (float)(this->m_positions).m_base.size;
            if (((uint)fVar35 <= (uint)fVar28) || ((uint)fVar35 <= (uint)fVar33)) goto LAB_001a1fc5;
            puVar9 = (this->m_positions).m_base.buffer;
            fVar28 = *(float *)(puVar9 + uVar17 * 0xc) - *(float *)(puVar9 + uVar23 * 0xc);
            fVar33 = *(float *)(puVar9 + uVar17 * 0xc + 4) - *(float *)(puVar9 + uVar23 * 0xc + 4);
            fVar35 = *(float *)(puVar9 + uVar17 * 0xc + 8) - *(float *)(puVar9 + uVar23 * 0xc + 8);
            lVar22 = lVar22 + 1;
          } while (0.0 < SQRT(fVar35 * fVar35 + fVar28 * fVar28 + fVar33 * fVar33));
          ignore = true;
          if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
            (*(code *)internal::s_print)
                      (SUB84((double)*(float *)(puVar9 + uVar23 * 0xc),0),
                       (double)*(float *)(puVar9 + uVar23 * 0xc + 4),
                       (double)*(float *)(puVar9 + uVar23 * 0xc + 8),
                       (double)*(float *)(puVar9 + uVar17 * 0xc),
                       (double)*(float *)(puVar9 + uVar17 * 0xc + 4),
                       (double)*(float *)(puVar9 + uVar17 * 0xc + 8),
                       "   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n"
                      );
LAB_001a1cf8:
            ignore = true;
          }
          goto LAB_001a1d0a;
        }
LAB_001a19a5:
        pAVar12 = local_40;
        if (local_40[1].meshCount == 0xffffffff) {
          TVar14 = internal::TaskScheduler::createTaskGroup(*(TaskScheduler **)(local_40 + 4),0);
          pAVar12[1].meshCount = TVar14.value;
        }
        puVar16 = (undefined8 *)(*(code *)internal::s_realloc)(0,0x10);
        if (puVar16 != (undefined8 *)0x0) {
          *puVar16 = pAVar12;
          puVar16[1] = this;
          task.userData = puVar16;
          task.func = runAddMeshTask;
          internal::TaskScheduler::run
                    (*(TaskScheduler **)(pAVar12 + 4),(TaskGroupHandle)pAVar12[1].meshCount,task);
          pAVar12[1].width = pAVar12[1].width + 1;
          return Success;
        }
      }
LAB_001a20dc:
      __assert_fail("mem",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x154,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)"
                   );
    }
  }
  else {
    EVar18 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return EVar18;
LAB_001a1b7e:
  do {
    fVar28 = (&local_70.x)[lVar22];
    uVar23 = (ulong)(uint)fVar28;
    if ((this->m_positions).m_base.size <= (uint)fVar28) goto LAB_001a1fc5;
    puVar9 = (this->m_positions).m_base.buffer;
    if (((NAN(*(float *)(puVar9 + uVar23 * 0xc))) || (NAN(*(float *)(puVar9 + uVar23 * 0xc + 4))))
       || (NAN(*(float *)(puVar9 + uVar23 * 0xc + 8)))) {
      ignore = true;
      if ((internal::s_print == (undefined *)0x0) || (internal::s_printVerbose != '\x01'))
      goto LAB_001a1d0a;
      pcVar26 = "   NAN position in face: %d\n";
LAB_001a1cee:
      (*(code *)internal::s_print)(pcVar26,uVar24 & 0xffffffff);
      goto LAB_001a1cf8;
    }
    if (meshDecl->vertexNormalData != (void *)0x0) {
      if ((this->m_flags & 4) == 0) {
        __assert_fail("m_flags & MeshFlags::HasNormals",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0xba4,"const Vector3 &xatlas::internal::Mesh::normal(uint32_t) const");
      }
      if ((this->m_normals).m_base.size <= (uint)fVar28) goto LAB_001a1fc5;
      puVar9 = (this->m_normals).m_base.buffer;
      if (((NAN(*(float *)(puVar9 + uVar23 * 0xc))) || (NAN(*(float *)(puVar9 + uVar23 * 0xc + 4))))
         || (NAN(*(float *)(puVar9 + uVar23 * 0xc + 8)))) {
        ignore = true;
        if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
          pcVar26 = "   NAN normal in face: %d\n";
          goto LAB_001a1cee;
        }
        goto LAB_001a1d0a;
      }
    }
    if (meshDecl->vertexUvData != (void *)0x0) {
      if ((this->m_texcoords).m_base.size <= (uint)fVar28) {
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,
                      "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
                     );
      }
      puVar9 = (this->m_texcoords).m_base.buffer;
      if ((NAN(*(float *)(puVar9 + uVar23 * 8))) || (NAN(*(float *)(puVar9 + uVar23 * 8 + 4)))) {
        ignore = true;
        if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
          pcVar26 = "   NAN texture coordinate in face: %d\n";
          goto LAB_001a1cee;
        }
        goto LAB_001a1d0a;
      }
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  ignore = false;
LAB_001a1d0a:
  fVar33 = local_70.z;
  uVar10 = local_70._0_8_;
  fVar28 = (float)(this->m_positions).m_base.size;
  if ((uint)fVar28 <= (uint)local_70.x) {
LAB_001a1fc5:
    __assert_fail("index < m_base.size",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x4a8,
                  "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
                 );
  }
  local_50 = lVar19;
  if (((uint)fVar28 <= (uint)local_70.y) || ((uint)fVar28 <= (uint)local_70.z)) goto LAB_001a1fc5;
  if (ignore != false) goto LAB_001a1d40;
  puVar9 = (this->m_positions).m_base.buffer;
  pfVar1 = (float *)(puVar9 + (local_70._0_8_ & 0xffffffff) * 0xc);
  pfVar2 = (float *)(puVar9 + (ulong)(uint)local_70.y * 0xc);
  pfVar3 = (float *)(puVar9 + (ulong)(uint)local_70.z * 0xc);
  fVar28 = *pfVar2 - *pfVar1;
  fVar30 = pfVar2[1] - pfVar1[1];
  fVar35 = pfVar2[2] - pfVar1[2];
  fVar34 = *pfVar3 - *pfVar1;
  fVar29 = pfVar3[1] - pfVar1[1];
  fVar32 = pfVar3[2] - pfVar1[2];
  fVar31 = fVar30 * fVar32 - fVar29 * fVar35;
  fVar35 = fVar35 * fVar34 - fVar32 * fVar28;
  fVar28 = fVar29 * fVar28 - fVar34 * fVar30;
  fVar28 = SQRT(fVar28 * fVar28 + fVar31 * fVar31 + fVar35 * fVar35) * 0.5;
  if (fVar28 <= 1.1920929e-07) {
    ignore = true;
    if ((internal::s_print == (undefined *)0x0) || (internal::s_printVerbose != '\x01'))
    goto LAB_001a1d40;
    (*(code *)internal::s_print)
              (SUB84((double)fVar28,0),"   Zero area face: %d, indices (%d %d %d), area is %f\n",
               uVar24 & 0xffffffff,local_70._0_8_ & 0xffffffff,local_70.y,local_70.z);
  }
  else {
    fVar35 = meshDecl->epsilon;
    if (((((fVar35 < ABS(*pfVar1 - *pfVar2)) || (fVar35 < ABS(pfVar1[1] - pfVar2[1]))) ||
         (fVar35 < ABS(pfVar1[2] - pfVar2[2]))) &&
        (((fVar35 < ABS(*pfVar1 - *pfVar3) || (fVar35 < ABS(pfVar1[1] - pfVar3[1]))) ||
         (fVar35 < ABS(pfVar1[2] - pfVar3[2]))))) &&
       (((fVar35 < ABS(*pfVar2 - *pfVar3) || (fVar35 < ABS(pfVar2[1] - pfVar3[1]))) ||
        (fVar35 < ABS(pfVar2[2] - pfVar3[2]))))) goto LAB_001a1d40;
    ignore = true;
    if ((internal::s_print == (undefined *)0x0) ||
       (ignore = true, internal::s_printVerbose != '\x01')) goto LAB_001a1d40;
    (*(code *)internal::s_print)
              (SUB84((double)fVar28,0),"   Degenerate face: %d, area is %f\n",uVar24 & 0xffffffff);
  }
  ignore = true;
LAB_001a1d40:
  uVar11 = local_70._0_8_;
  if ((meshDecl->faceIgnoreData != (bool *)0x0) && (meshDecl->faceIgnoreData[uVar24] != false)) {
    ignore = true;
  }
  local_70.x = (float)uVar10;
  local_70.y = SUB84(uVar10,4);
  local_60.x = local_70.x;
  local_60.y = local_70.y;
  local_60.z = fVar33;
  local_70._0_8_ = uVar11;
  internal::Mesh::addFace(this,(uint32_t *)&local_60,ignore,true);
  uVar24 = uVar24 + 1;
  lVar19 = local_50 + 3;
  if (uVar24 == local_38) goto LAB_001a19a5;
  goto LAB_001a1a22;
}

Assistant:

AddMeshError::Enum AddMesh(Atlas *atlas, const MeshDecl &meshDecl, uint32_t meshCountHint)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->uvMeshes.isEmpty()) {
		XA_PRINT_WARNING("AddMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->meshCount == 0)
		internal::s_profile.addMeshReal = clock();
#endif
	// Don't know how many times AddMesh will be called, so progress needs to adjusted each time.
	if (!ctx->addMeshProgress) {
		ctx->addMeshProgress = XA_NEW_ARGS(internal::MemTag::Default, internal::Progress, ProgressCategory::AddMesh, ctx->progressFunc, ctx->progressUserData, 1);
	}
	else {
		ctx->addMeshProgress->setMaxValue(internal::max(ctx->meshCount + 1, meshCountHint));
	}
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = meshDecl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? meshDecl.indexCount : meshDecl.vertexCount;
	XA_PRINT("Adding mesh %d: %u vertices, %u triangles\n", ctx->meshCount, meshDecl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i);
			if (index >= meshDecl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	uint32_t meshFlags = internal::MeshFlags::HasFaceGroups | internal::MeshFlags::HasIgnoredFaces;
	if (meshDecl.vertexNormalData)
		meshFlags |= internal::MeshFlags::HasNormals;
	internal::Mesh *mesh = XA_NEW_ARGS(internal::MemTag::Mesh, internal::Mesh, meshDecl.epsilon, meshDecl.vertexCount, indexCount / 3, meshFlags, ctx->meshCount);
	for (uint32_t i = 0; i < meshDecl.vertexCount; i++) {
		internal::Vector3 normal(0.0f);
		internal::Vector2 texcoord(0.0f);
		if (meshDecl.vertexNormalData)
			normal = DecodeNormal(meshDecl, i);
		if (meshDecl.vertexUvData)
			texcoord = DecodeUv(meshDecl, i);
		mesh->addVertex(DecodePosition(meshDecl, i), normal, texcoord);
	}
	for (uint32_t i = 0; i < indexCount / 3; i++) {
		uint32_t tri[3];
		for (int j = 0; j < 3; j++)
			tri[j] = hasIndices ? DecodeIndex(meshDecl.indexFormat, meshDecl.indexData, meshDecl.indexOffset, i * 3 + j) : i * 3 + j;
		bool ignore = false;
		// Check for degenerate or zero length edges.
		for (int j = 0; j < 3; j++) {
			const uint32_t index1 = tri[j];
			const uint32_t index2 = tri[(j + 1) % 3];
			if (index1 == index2) {
				ignore = true;
				XA_PRINT("   Degenerate edge: index %d, index %d\n", index1, index2);
				break;
			}
			const internal::Vector3 &pos1 = mesh->position(index1);
			const internal::Vector3 &pos2 = mesh->position(index2);
			if (internal::length(pos2 - pos1) <= 0.0f) {
				ignore = true;
				XA_PRINT("   Zero length edge: index %d position (%g %g %g), index %d position (%g %g %g)\n", index1, pos1.x, pos1.y, pos1.z, index2, pos2.x, pos2.y, pos2.z);
				break;
			}
		}
		// Ignore faces with any nan vertex attributes.
		if (!ignore) {
			for (int j = 0; j < 3; j++) {
				const internal::Vector3 &pos = mesh->position(tri[j]);
				if (internal::isNan(pos.x) || internal::isNan(pos.y) || internal::isNan(pos.z)) {
					XA_PRINT("   NAN position in face: %d\n", i);
					ignore = true;
					break;
				}
				if (meshDecl.vertexNormalData) {
					const internal::Vector3 &normal = mesh->normal(tri[j]);
					if (internal::isNan(normal.x) || internal::isNan(normal.y) || internal::isNan(normal.z)) {
						XA_PRINT("   NAN normal in face: %d\n", i);
						ignore = true;
						break;
					}
				}
				if (meshDecl.vertexUvData) {
					const internal::Vector2 &uv = mesh->texcoord(tri[j]);
					if (internal::isNan(uv.x) || internal::isNan(uv.y)) {
						XA_PRINT("   NAN texture coordinate in face: %d\n", i);
						ignore = true;
						break;
					}
				}
			}
		}
		const internal::Vector3 &a = mesh->position(tri[0]);
		const internal::Vector3 &b = mesh->position(tri[1]);
		const internal::Vector3 &c = mesh->position(tri[2]);
		// Check for zero area faces.
		float area = 0.0f;
		if (!ignore) {
			area = internal::length(internal::cross(b - a, c - a)) * 0.5f;
			if (area <= internal::kAreaEpsilon) {
				ignore = true;
				XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", i, tri[0], tri[1], tri[2], area);
			}
		}
		if (!ignore) {
			if (internal::equal(a, b, meshDecl.epsilon) || internal::equal(a, c, meshDecl.epsilon) || internal::equal(b, c, meshDecl.epsilon)) {
				ignore = true;
				XA_PRINT("   Degenerate face: %d, area is %f\n", i, area);
			}
		}
		if (meshDecl.faceIgnoreData && meshDecl.faceIgnoreData[i])
			ignore = true;
		mesh->addFace(tri[0], tri[1], tri[2], ignore);
	}
	XA_PROFILE_END(addMeshCopyData)
	if (ctx->addMeshTaskGroup.value == UINT32_MAX)
		ctx->addMeshTaskGroup = ctx->taskScheduler->createTaskGroup();
	AddMeshTaskArgs *taskArgs = XA_NEW(internal::MemTag::Default, AddMeshTaskArgs); // The task frees this.
	taskArgs->ctx = ctx;
	taskArgs->mesh = mesh;
	internal::Task task;
	task.userData = taskArgs;
	task.func = runAddMeshTask;
	ctx->taskScheduler->run(ctx->addMeshTaskGroup, task);
	ctx->meshCount++;
	return AddMeshError::Success;
}